

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O1

int64_t __thiscall TPZGraphElT::EqNum(TPZGraphElT *this,TPZVec<int> *co)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int64_t iVar5;
  uint uVar6;
  int iVar7;
  TPZGraphNode *this_00;
  long lVar8;
  ulong uVar9;
  int orient [3];
  uint local_24 [3];
  
  iVar2 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar8 = 0;
    if (lVar4 != 2) {
      lVar8 = lVar1;
    }
    local_24[lVar4] =
         (uint)(this->fConnects[lVar8]->fSequenceNumber < this->fConnects[lVar4]->fSequenceNumber);
    lVar4 = lVar1;
  } while (lVar1 != 3);
  iVar7 = 1 << ((byte)iVar2 & 0x1f);
  piVar3 = co->fStore;
  iVar2 = *piVar3;
  if ((iVar2 == 0) && (piVar3[1] == 0)) {
    this_00 = this->fConnects[0];
  }
  else if ((iVar2 == iVar7) && (piVar3[1] == 0)) {
    this_00 = this->fConnects[1];
  }
  else {
    uVar6 = 3;
    if ((iVar2 != 0) || (uVar6 = 2, piVar3[1] != iVar7)) {
      uVar9 = 1;
      if (iVar2 + piVar3[1] != iVar7) {
        uVar9 = (ulong)uVar6;
      }
      if (piVar3[1] == 0) {
        uVar9 = 0;
      }
      TPZGraphNode::FirstPoint
                (*(TPZGraphNode **)((long)this->fConnects + (ulong)(uint)((int)uVar9 * 8) + 0x18));
      iVar5 = (*(code *)(&DAT_0158f560 + *(int *)(&DAT_0158f560 + uVar9 * 4)))();
      return iVar5;
    }
    this_00 = this->fConnects[2];
  }
  iVar5 = TPZGraphNode::FirstPoint(this_00);
  return iVar5;
}

Assistant:

int64_t TPZGraphElT::EqNum(TPZVec<int> &co){
	int orient[3];
	int loc;
	int res = fGraphMesh->Res();
	int imax = (1<<res);
	for(int is=0;is<3;is++) {
		orient[is] = (fConnects[is]->SequenceNumber() > fConnects[(is+1)%3]->SequenceNumber()) ? 1 : 0;
	}
	if(co[0]==0 && co[1]==0) return fConnects[0]->FirstPoint();
	if(co[0]==imax && co[1]==0) return fConnects[1]->FirstPoint();
	if(co[0]==0 && co[1]==imax) return fConnects[2]->FirstPoint();
	
	if(co[1]==0) loc = 0;
	else if(co[0]+co[1]==imax) loc=1;
	else if(co[0]==0) loc=2;
	else loc=3;
	int64_t first = fConnects[3+loc]->FirstPoint();
	int64_t neq;
	switch(loc) {
		case 0:
			neq = first + (co[0]-1) + orient[loc]*(imax-1-co[0]-co[0]+1);
			break;
		case 1:
			neq = first + (imax-1-co[0]) + orient[loc]*(co[0]-1-imax+1+co[0]);
			break;
		case 2:
			neq = first + (imax-1-co[1]) + orient[loc]*(co[1]-1-imax+1+co[1]);
			break;
		case 3:
		{
			neq = first + (co[1]-1);
			for(int run=1;run<co[0];run++) neq += imax-run-1;
			break;
		}
		default:
			neq = 0;
			break;
	}
	return neq;
}